

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionObservationHistoryTree.cpp
# Opt level: O2

void __thiscall
ActionObservationHistoryTree::SetSuccessor
          (ActionObservationHistoryTree *this,Index aI,Index oI,ActionObservationHistoryTree *suc)

{
  bool bVar1;
  ActionObservationHistoryTree *this_00;
  E *this_01;
  ulong sucI;
  
  if (this->_m_nodeType != O_SUC) {
    sucI = (ulong)aI;
    bVar1 = TreeNode<ActionObservationHistory>::ExistsSuccessor
                      (&this->super_TreeNode<ActionObservationHistory>,sucI);
    if (bVar1) {
      this_00 = (ActionObservationHistoryTree *)
                TreeNode<ActionObservationHistory>::GetSuccessor
                          (&this->super_TreeNode<ActionObservationHistory>,sucI);
    }
    else {
      this_00 = (ActionObservationHistoryTree *)operator_new(0x60);
      ActionObservationHistoryTree(this_00,O_SUC);
      TreeNode<ActionObservationHistory>::SetSuccessor
                (&this->super_TreeNode<ActionObservationHistory>,sucI,
                 (TreeNode<ActionObservationHistory> *)this_00);
    }
    TreeNode<ActionObservationHistory>::SetSuccessor
              (&this_00->super_TreeNode<ActionObservationHistory>,(ulong)oI,
               &suc->super_TreeNode<ActionObservationHistory>);
    return;
  }
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,
       "Trying ActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, ActionObservationHistoryTree* suc)  on O_SUC node"
      );
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

void ActionObservationHistoryTree::SetSuccessor(Index aI, Index oI,
        ActionObservationHistoryTree* suc)
{
    if (_m_nodeType == O_SUC)
        throw E("Trying ActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, ActionObservationHistoryTree* suc)  on O_SUC node");

    //first see if necessary to create a new  intermediate node
    ActionObservationHistoryTree* oNode; 
    if(this->TreeNode<ActionObservationHistory>::ExistsSuccessor(aI))
        oNode = (ActionObservationHistoryTree*)
            this->TreeNode<ActionObservationHistory>::GetSuccessor(aI);
    else //we need to create an intermediate node
    {
        oNode = new ActionObservationHistoryTree(O_SUC);

        //which is the aI'th successor of this node
        this->TreeNode<ActionObservationHistory>::SetSuccessor(aI, oNode);
    }

    //let oNode point to the actual successor.
    //Note: SetSuccessor with 1 index should give no problem for O_SUC nodes
    oNode->TreeNode<ActionObservationHistory>::SetSuccessor(oI, suc);
}